

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

long sd_line(int child,long skip_count)

{
  undefined8 in_RSI;
  int in_EDI;
  int j;
  int i;
  int iVar1;
  int in_stack_ffffffffffffffec;
  int iVar2;
  
  for (iVar1 = 0; iVar2 = (int)((ulong)in_RSI >> 0x20), iVar1 < 7; iVar1 = iVar1 + 1) {
    for (in_stack_ffffffffffffffec = 0xe; iVar2 = (int)((ulong)in_RSI >> 0x20),
        in_stack_ffffffffffffffec < 0x19; in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1)
    {
      advanceStream(iVar2,CONCAT44(in_stack_ffffffffffffffec,iVar1),0);
    }
    advanceStream(iVar2,CONCAT44(in_stack_ffffffffffffffec,iVar1),0);
  }
  if (in_EDI == 1) {
    advanceStream(iVar2,CONCAT44(in_stack_ffffffffffffffec,iVar1),0);
    advanceStream(iVar2,CONCAT44(in_stack_ffffffffffffffec,iVar1),0);
  }
  return 0;
}

Assistant:

long 
sd_line(int child, DSS_HUGE skip_count)
	{
	int i,j;
	
	for (j=0; j < O_LCNT_MAX; j++)
	{
		for (i=L_QTY_SD; i<= L_RFLG_SD; i++)
/*
			if (scale >= 30000 && i == L_PKEY_SD)
				ADVANCE_STREAM64(i, skip_count);
			else
*/
				ADVANCE_STREAM(i, skip_count);
		ADVANCE_STREAM(L_CMNT_SD, skip_count * 2);
	}
	
	/* need to special case this as the link between master and detail */
	if (child == 1)
	{
		ADVANCE_STREAM(O_ODATE_SD, skip_count);
		ADVANCE_STREAM(O_LCNT_SD, skip_count);
	}
	
	return(0L);
	}